

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryOptimizer.cpp
# Opt level: O3

Query * inline_suboperations(Query *__return_storage_ptr__,Query *q,bool *changed)

{
  QueryType QVar1;
  pointer pQVar2;
  pointer pQVar3;
  pointer pQVar4;
  QueryType *pQVar5;
  vector<Query,_std::allocator<Query>_> *pvVar6;
  Query *subquery;
  pointer __args;
  Query *query;
  pointer pQVar7;
  vector<Query,_std::allocator<Query>_> newqueries;
  vector<Query,_std::allocator<Query>_> local_98;
  bool *local_80;
  Query local_78;
  
  local_80 = changed;
  pQVar5 = Query::get_type(q);
  if ((*pQVar5 != AND) && (pQVar5 = Query::get_type(q), *pQVar5 != OR)) {
    __return_storage_ptr__->type = q->type;
    pQVar4 = (q->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
             super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
    super__Vector_impl_data._M_start =
         (q->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
         super__Vector_impl_data._M_start;
    (__return_storage_ptr__->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
    super__Vector_impl_data._M_finish = pQVar4;
    (__return_storage_ptr__->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (q->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    (q->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    (q->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    (q->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    __return_storage_ptr__->count = q->count;
    __return_storage_ptr__->ngram = q->ngram;
    pQVar7 = (q->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
             super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
    super__Vector_impl_data._M_start =
         (q->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
         super__Vector_impl_data._M_start;
    (__return_storage_ptr__->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
    super__Vector_impl_data._M_finish = pQVar7;
    (__return_storage_ptr__->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (q->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    (q->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    (q->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    (q->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    return __return_storage_ptr__;
  }
  local_98.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_98.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_98.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pvVar6 = Query::as_queries(q);
  pQVar7 = (pvVar6->super__Vector_base<Query,_std::allocator<Query>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pQVar2 = (pvVar6->super__Vector_base<Query,_std::allocator<Query>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pQVar7 != pQVar2) {
    do {
      pQVar5 = Query::get_type(pQVar7);
      QVar1 = *pQVar5;
      pQVar5 = Query::get_type(q);
      if (QVar1 == *pQVar5) {
        pvVar6 = Query::as_queries(pQVar7);
        pQVar3 = (pvVar6->super__Vector_base<Query,_std::allocator<Query>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        for (__args = (pvVar6->super__Vector_base<Query,_std::allocator<Query>_>)._M_impl.
                      super__Vector_impl_data._M_start; __args != pQVar3; __args = __args + 1) {
          std::vector<Query,_std::allocator<Query>_>::emplace_back<Query>(&local_98,__args);
        }
        *local_80 = true;
      }
      else {
        std::vector<Query,_std::allocator<Query>_>::emplace_back<Query>(&local_98,pQVar7);
      }
      pQVar7 = pQVar7 + 1;
    } while (pQVar7 != pQVar2);
  }
  pQVar5 = Query::get_type(q);
  Query::Query(&local_78,pQVar5,&local_98);
  __return_storage_ptr__->type = local_78.type;
  (__return_storage_ptr__->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_78.value.super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
       super__Vector_impl_data._M_start;
  (__return_storage_ptr__->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_78.value.super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_78.value.super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_78.value.super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  local_78.value.super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  local_78.value.super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  __return_storage_ptr__->count = local_78.count;
  __return_storage_ptr__->ngram = local_78.ngram;
  (__return_storage_ptr__->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_78.queries.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
       super__Vector_impl_data._M_start;
  (__return_storage_ptr__->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_78.queries.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_78.queries.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_78.queries.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  local_78.queries.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  local_78.queries.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  std::vector<Query,_std::allocator<Query>_>::~vector(&local_78.queries);
  std::vector<QToken,_std::allocator<QToken>_>::~vector(&local_78.value);
  std::vector<Query,_std::allocator<Query>_>::~vector(&local_98);
  return __return_storage_ptr__;
}

Assistant:

Query inline_suboperations(Query &&q, bool *changed) {
    if (q.get_type() != QueryType::AND && q.get_type() != QueryType::OR) {
        return std::move(q);
    }
    std::vector<Query> newqueries;
    for (auto &&query : q.as_queries()) {
        if (query.get_type() == q.get_type()) {
            for (auto &&subquery : query.as_queries()) {
                newqueries.emplace_back(std::move(subquery));
            }
            *changed = true;
        } else {
            newqueries.emplace_back(std::move(query));
        }
    }
    return std::move(Query(q.get_type(), std::move(newqueries)));
}